

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.h
# Opt level: O0

bool __thiscall Kumu::AttributeVisitor::Element(AttributeVisitor *this,XMLElement *e)

{
  bool bVar1;
  __type _Var2;
  pointer pNVar3;
  _Self local_38;
  _List_node_base *local_30;
  _List_const_iterator<Kumu::NVPair> local_28;
  const_iterator i;
  AttributeList *l;
  XMLElement *e_local;
  AttributeVisitor *this_local;
  
  i._M_node = (_List_node_base *)XMLElement::GetAttributes_abi_cxx11_(e);
  std::_List_const_iterator<Kumu::NVPair>::_List_const_iterator(&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::begin(i._M_node);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::end(i._M_node);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    pNVar3 = std::_List_const_iterator<Kumu::NVPair>::operator->(&local_28);
    _Var2 = std::operator==(&pNVar3->name,&this->attr_name);
    if (_Var2) {
      pNVar3 = std::_List_const_iterator<Kumu::NVPair>::operator->(&local_28);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->value_list,&pNVar3->value);
    }
    std::_List_const_iterator<Kumu::NVPair>::operator++(&local_28);
  }
  return true;
}

Assistant:

bool Element(const XMLElement& e)
    {
      const AttributeList& l = e.GetAttributes();
      AttributeList::const_iterator i;
 
      for ( i = l.begin(); i != l.end(); ++i )
	{
	  if ( i->name == attr_name )
	    {
	      value_list.insert(i->value);
	    }
	}

      return true;
    }